

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valtype.h
# Opt level: O2

bool __thiscall wasm::analysis::ValType::meet(ValType *this,Element *meetee,Element meeter)

{
  Type TVar1;
  bool bVar2;
  
  TVar1.id = meetee->id;
  if (meeter.id == 0 || TVar1.id == meeter.id) {
LAB_001b2869:
    bVar2 = false;
  }
  else {
    if (TVar1.id != 0) {
      meeter.id = ::wasm::Type::getGreatestLowerBound(TVar1,meeter.id);
      if (meeter.id == meetee->id) goto LAB_001b2869;
    }
    meetee->id = (uintptr_t)meeter;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool meet(Element& meetee, Element meeter) const noexcept {
    if (meetee == meeter || meeter == Type::none) {
      return false;
    }
    if (meetee == Type::none) {
      meetee = meeter;
      return true;
    }
    auto glb = Type::getGreatestLowerBound(meetee, meeter);
    if (glb != meetee) {
      meetee = glb;
      return true;
    }
    return false;
  }